

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O3

phits_particle_t * phits_load_particle(phits_file_t ff)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  FILE *pFVar8;
  phits_particle_t *ppVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  
  iVar2 = *(int *)((long)ff.internal + 0x8c);
  if (iVar2 == 0) {
LAB_00102a01:
    ppVar9 = (phits_particle_t *)0x0;
  }
  else {
    if (*(int *)((long)ff.internal + 0x108) == 0) {
      iVar2 = mcpl_generic_fread_try(ff.internal,(long)ff.internal + 0x90,1);
      if (iVar2 != 1) {
        *(undefined4 *)((long)ff.internal + 0x8c) = 0;
        goto LAB_00102a01;
      }
      *(undefined4 *)((long)ff.internal + 0x108) = 1;
      iVar2 = *(int *)((long)ff.internal + 0x8c);
      iVar3 = phits_tryload_reclen
                        ((phits_fileinternal_t *)ff.internal,*(int *)((long)ff.internal + 0x88));
      pFVar8 = (FILE *)phits_impl_stdout_data::thefh;
      if (iVar3 == 0) {
        if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar8 = _stdout;
        }
        pcVar6 = "Problems loading particle data record!";
LAB_00102a56:
        fprintf(pFVar8,"ERROR: %s\n",pcVar6);
        exit(1);
      }
      if (*(int *)((long)ff.internal + 0x8c) != iVar2) {
        if (phits_impl_stdout_data::thefh == (FILE *)0x0) {
          pFVar8 = _stdout;
        }
        pcVar6 = 
        "Problems loading particle data record - particle data length changed mid-file (perhaps it is not actually a binary PHITS dump file after all?)!"
        ;
        goto LAB_00102a56;
      }
    }
    lVar5 = (long)*(int *)((long)ff.internal + 0x88);
    lVar7 = (long)*(double *)((long)ff.internal + lVar5 + 0x90);
    *(long *)((long)ff.internal + 0x78) = lVar7;
    *(undefined8 *)((long)ff.internal + 0x18) = *(undefined8 *)((long)ff.internal + lVar5 + 0x98);
    *(undefined8 *)((long)ff.internal + 0x20) = *(undefined8 *)((long)ff.internal + lVar5 + 0xa0);
    *(undefined8 *)((long)ff.internal + 0x28) = *(undefined8 *)((long)ff.internal + lVar5 + 0xa8);
    *(undefined8 *)((long)ff.internal + 0x30) = *(undefined8 *)((long)ff.internal + lVar5 + 0xb0);
    *(undefined8 *)((long)ff.internal + 0x38) = *(undefined8 *)((long)ff.internal + lVar5 + 0xb8);
    *(undefined8 *)((long)ff.internal + 0x40) = *(undefined8 *)((long)ff.internal + lVar5 + 0xc0);
    *(undefined8 *)((long)ff.internal + 0x68) = *(undefined8 *)((long)ff.internal + lVar5 + 200);
    *(undefined8 *)((long)ff.internal + 0x60) = *(undefined8 *)((long)ff.internal + lVar5 + 0xd0);
    *(undefined8 *)((long)ff.internal + 0x70) = *(undefined8 *)((long)ff.internal + lVar5 + 0xd8);
    if (iVar2 == 0x68) {
      *(undefined8 *)((long)ff.internal + 0x48) = *(undefined8 *)((long)ff.internal + lVar5 + 0xe0);
      *(undefined8 *)((long)ff.internal + 0x50) = *(undefined8 *)((long)ff.internal + lVar5 + 0xe8);
      uVar1 = *(undefined8 *)((long)ff.internal + lVar5 + 0xf0);
      uVar10 = (undefined4)uVar1;
      uVar11 = (undefined4)((ulong)uVar1 >> 0x20);
    }
    else {
      *(undefined8 *)((long)ff.internal + 0x48) = 0;
      *(undefined8 *)((long)ff.internal + 0x50) = 0;
      uVar10 = 0;
      uVar11 = 0;
    }
    ppVar9 = (phits_particle_t *)((long)ff.internal + 0x18);
    *(ulong *)((long)ff.internal + 0x58) = CONCAT44(uVar11,uVar10);
    iVar4 = conv_code_phits2pdg((int32_t)lVar7);
    *(long *)((long)ff.internal + 0x80) = (long)iVar4;
    *(undefined4 *)((long)ff.internal + 0x108) = 0;
  }
  return ppVar9;
}

Assistant:

const phits_particle_t * phits_load_particle(phits_file_t ff)
{
  phits_fileinternal_t * f = (phits_fileinternal_t *)ff.internal;
  assert(f);

  if (!f->particlesize) {
    //EOF already
    return 0;
  }

  assert( f->particlesize == 10*sizeof(double) || f->particlesize == 13*sizeof(double) );

  if (!f->lbuf) {
    if (!phits_ensure_load(f, 1)) {
      //Can't read a single byte - assume EOF:
      f->particlesize = 0;
      return 0;
    }
    //Try to load another record
    int old_reclen = f->reclen;
    (void)old_reclen;//otherwise unused if assert inactive.
    unsigned old_particlesize = f->particlesize;
    if (!phits_tryload_reclen(f,f->reclen)) {
      phits_error("Problems loading particle data record!");
      //return 0;
    }
    assert(f->reclen==old_reclen);
    if ( f->particlesize != old_particlesize) {
      phits_error("Problems loading particle data record - particle"
                  " data length changed mid-file (perhaps it is not"
                  " actually a binary PHITS dump file after all?)!");
      //return 0;
    }
  }

  assert( f->lbuf == f->particlesize + f->reclen * 2 );
  double * pdata = (double*)(f->buf+f->reclen);
  phits_particle_t * pp =  & (f->part);
  pp->rawtype = (long)pdata[0];
  //NB: PHITS units, not MCPL units here (only difference is time unit which is ns in PHITS and ms in MCPL):
  pp->x = pdata[1];//cm
  pp->y = pdata[2];//cm
  pp->z = pdata[3];//cm
  pp->dirx = pdata[4];
  pp->diry = pdata[5];
  pp->dirz = pdata[6];
  pp->ekin = pdata[7];//MeV
  pp->weight = pdata[8];
  pp->time = pdata[9];//ns
  if (f->particlesize == 13*sizeof(double)) {
    pp->polx = pdata[10];
    pp->poly = pdata[11];
    pp->polz = pdata[12];
  } else {
    pp->polx = 0.0;
    pp->poly = 0.0;
    pp->polz = 0.0;
  }

  pp->pdgcode = conv_code_phits2pdg(pp->rawtype);

  //Mark as used:
  f->lbuf = 0;

  return pp;
}